

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_io_ss.c
# Opt level: O1

int sinkPutbuf(gdIOCtx *ctx,void *buf,int size)

{
  int iVar1;
  
  iVar1 = (**(code **)ctx[1].getBuf)(*(undefined8 *)(ctx[1].getBuf + 8));
  if (iVar1 < 1) {
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int sinkPutbuf(gdIOCtx *ctx, const void *buf, int size)
{
	ssIOCtxPtr lctx;
	int res;

	lctx = (ssIOCtx *)ctx;

	res = (lctx->snk->sink)(lctx->snk->context, buf, size);

	if (res <= 0) {
		return 0;
	} else {
		return res;
	}
}